

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_feature.c
# Opt level: O0

int main(int argc,char **args)

{
  int iVar1;
  light_pcapng p_Var2;
  _func_int_light_pcapng_void_ptr_size_t *in_RSI;
  int in_EDI;
  int ret;
  float *features;
  light_pcapng pcapng;
  char *file;
  int i;
  light_pcapng pcapng_00;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  undefined4 uVar4;
  
  uVar4 = 0;
  for (iVar3 = 1; iVar3 < in_EDI; iVar3 = iVar3 + 1) {
    pcapng_00 = *(light_pcapng *)(in_RSI + (long)iVar3 * 8);
    p_Var2 = light_read_from_path((char *)CONCAT44(iVar3,in_stack_ffffffffffffffe8));
    if (p_Var2 == (light_pcapng)0x0) {
      fprintf(_stderr,"Unable to read pcapng: %s\n",pcapng_00);
    }
    else {
      iVar1 = light_section_feature_extraction
                        ((light_pcapng)CONCAT44(uVar4,in_EDI),in_RSI,
                         (void **)CONCAT44(iVar3,in_stack_ffffffffffffffe8),(size_t)pcapng_00,
                         (light_feature_t)((ulong)p_Var2 >> 0x20));
      if (iVar1 != 0) {
        fprintf(_stderr,"Error while extracting features for %s\n",pcapng_00);
      }
      light_pcapng_release(pcapng_00);
      free((void *)0x0);
    }
  }
  return 0;
}

Assistant:

int main(int argc, const char **args) {
	int i;

	for (i = 1; i < argc; ++i) {
		const char *file = args[i];
		light_pcapng pcapng = light_read_from_path(file);
		if (pcapng != NULL) {
			float *features = NULL;
			int ret = light_section_feature_extraction(pcapng, extractor, (void **)&features, FEATURE_LENGTH, LIGHT_FEATURE_FLOAT);

			if (ret != LIGHT_SUCCESS) {
				fprintf(stderr, "Error while extracting features for %s\n", file);
				goto release;
			}

			// TODO: Print or handle features.
release:
			light_pcapng_release(pcapng);
			free(features);
		}
		else {
			fprintf(stderr, "Unable to read pcapng: %s\n", file);
		}
	}

	return 0;
}